

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ContinuousAssignSyntax *pCVar1;
  Token TVar2;
  Token TVar3;
  Token *unaff_retaddr;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  DriveStrengthSyntax *in_stack_ffffffffffffff90;
  TimingControlSyntax *local_60;
  DriveStrengthSyntax *local_58;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  if (*(long *)(__fn + 0x60) == 0) {
    local_58 = (DriveStrengthSyntax *)0x0;
  }
  else {
    local_58 = deepClone<slang::syntax::DriveStrengthSyntax>
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (*(long *)(__fn + 0x68) == 0) {
    local_60 = (TimingControlSyntax *)0x0;
  }
  else {
    local_60 = deepClone<slang::syntax::TimingControlSyntax>
                         ((TimingControlSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                         );
  }
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_000000e0,in_stack_000000d8);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ContinuousAssignSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DriveStrengthSyntax*,slang::syntax::TimingControlSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,TVar2._0_8_,
                      (DriveStrengthSyntax **)local_58,(TimingControlSyntax **)local_60,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)TVar3.info,
                      unaff_retaddr);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ContinuousAssignSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ContinuousAssignSyntax>(
        *deepClone(node.attributes, alloc),
        node.assign.deepClone(alloc),
        node.strength ? deepClone(*node.strength, alloc) : nullptr,
        node.delay ? deepClone(*node.delay, alloc) : nullptr,
        *deepClone(node.assignments, alloc),
        node.semi.deepClone(alloc)
    );
}